

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroLi(Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,
                   int flags)

{
  bool bVar1;
  int32_t iVar2;
  string *psVar3;
  undefined4 in_register_0000000c;
  MipsImmediateData *immediates_00;
  uint in_R8D;
  initializer_list<AssemblyTemplateArgument> variables;
  AssemblyTemplateArgument *local_200;
  char *local_1d8;
  char *local_1b8;
  allocator<char> local_16a;
  allocator<char> local_169;
  AssemblyTemplateArgument *local_168;
  AssemblyTemplateArgument local_160;
  char *local_138;
  string asStack_130 [32];
  char *local_110;
  string local_108 [32];
  char *local_e8;
  string local_e0;
  undefined1 local_c0 [16];
  undefined1 local_b0 [8];
  string macroText;
  int32_t newValue;
  undefined1 local_68 [8];
  ExpressionValue value;
  char *templateLi;
  int flags_local;
  MipsImmediateData *immediates_local;
  MipsRegisterData *registers_local;
  Parser *parser_local;
  
  immediates_00 = (MipsImmediateData *)CONCAT44(in_register_0000000c,flags);
  value.strValue._value.field_2._8_8_ = anon_var_dwarf_29957b;
  bVar1 = Expression::isConstExpression(&(immediates_00->secondary).expression);
  if (bVar1) {
    Expression::evaluate((ExpressionValue *)local_68,&(immediates_00->secondary).expression);
    bVar1 = ExpressionValue::isFloat((ExpressionValue *)local_68);
    if (bVar1) {
      iVar2 = getFloatBits((float)(double)value._0_8_);
      createConstExpression((Expression *)((long)&macroText.field_2 + 8),(long)iVar2);
      Expression::operator=
                (&(immediates_00->secondary).expression,(Expression *)((long)&macroText.field_2 + 8)
                );
      Expression::~Expression((Expression *)((long)&macroText.field_2 + 8));
    }
    ExpressionValue::~ExpressionValue((ExpressionValue *)local_68);
  }
  preprocessMacro_abi_cxx11_
            ((string *)local_b0,(char *)value.strValue._value.field_2._8_8_,immediates_00);
  local_168 = &local_160;
  local_160.variableName = "%upper%";
  if ((in_R8D & 0x4000) == 0) {
    local_1b8 = "0";
  }
  else {
    local_1b8 = "1";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160.value,local_1b8,&local_169);
  local_168 = (AssemblyTemplateArgument *)&local_138;
  local_138 = "%lower%";
  if ((in_R8D & 0x8000) == 0) {
    local_1d8 = "0";
  }
  else {
    local_1d8 = "1";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_130,local_1d8,&local_16a);
  local_168 = (AssemblyTemplateArgument *)&local_110;
  local_110 = "%rs%";
  psVar3 = Identifier::string_abi_cxx11_((Identifier *)&(immediates->primary).expression);
  std::__cxx11::string::string(local_108,(string *)psVar3);
  local_168 = (AssemblyTemplateArgument *)&local_e8;
  local_e8 = "%imm%";
  Expression::toString_abi_cxx11_(&local_e0,&(immediates_00->secondary).expression);
  variables._M_array = (iterator)(ulong)in_R8D;
  local_c0._0_8_ = &local_160;
  local_c0._8_8_ = 4;
  variables._M_len = local_c0._0_8_;
  createMacro(parser,(string *)registers,(int)local_b0,variables);
  local_200 = (AssemblyTemplateArgument *)local_c0;
  do {
    local_200 = local_200 + -1;
    AssemblyTemplateArgument::~AssemblyTemplateArgument(local_200);
  } while (local_200 != &local_160);
  std::allocator<char>::~allocator(&local_16a);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string((string *)local_b0);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroLi(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* templateLi = R"(
		.if abs(%imm%) > 0xFFFFFFFF
			.error "Immediate value too big"
		.elseif %imm% & ~0xFFFF
			.if (%imm% & 0xFFFF8000) == 0xFFFF8000
				.if %lower%
					addiu	%rs%,r0, lo(%imm%)
				.endif
			.elseif (%imm% & 0xFFFF) == 0
				.if %upper%
					lui		%rs%, hi(%imm%)
				.elseif %lower%
					nop
				.endif
			.else
				.if %upper%
					lui		%rs%, hi(%imm%)
				.endif
				.if %lower%
					addiu 	%rs%, lo(%imm%)
				.endif
			.endif
		.else
			.if %lower%
				ori		%rs%,r0,%imm%
			.endif
		.endif
	)";

	// floats need to be treated as integers, convert them
	if (immediates.secondary.expression.isConstExpression())
	{
		ExpressionValue value = immediates.secondary.expression.evaluate();
		if (value.isFloat())
		{
			int32_t newValue = getFloatBits((float)value.floatValue);
			immediates.secondary.expression = createConstExpression(newValue);
		}
	}

	std::string macroText = preprocessMacro(templateLi,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%upper%",	(flags & MIPSM_UPPER) ? "1" : "0" },
			{ "%lower%",	(flags & MIPSM_LOWER) ? "1" : "0" },
			{ "%rs%",		registers.grs.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
	});
}